

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

size_t __thiscall llvm::raw_fd_ostream::preferred_buffer_size(raw_fd_ostream *this)

{
  int iVar1;
  stat statbuf;
  stat sStack_98;
  
  if (-1 < this->FD) {
    iVar1 = fstat(this->FD,&sStack_98);
    if ((iVar1 != 0) ||
       (((sStack_98.st_mode & 0xf000) == 0x2000 && (iVar1 = isatty(this->FD), iVar1 != 0)))) {
      sStack_98.st_blksize = 0;
    }
    return sStack_98.st_blksize;
  }
  __assert_fail("FD >= 0 && \"File not yet open!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x2bd,"virtual size_t llvm::raw_fd_ostream::preferred_buffer_size() const");
}

Assistant:

size_t raw_fd_ostream::preferred_buffer_size() const {
#if !defined(_MSC_VER) && !defined(__MINGW32__) && !defined(__minix)
  // Windows and Minix have no st_blksize.
  assert(FD >= 0 && "File not yet open!");
  struct stat statbuf;
  if (fstat(FD, &statbuf) != 0)
    return 0;

  // If this is a terminal, don't use buffering. Line buffering
  // would be a more traditional thing to do, but it's not worth
  // the complexity.
  if (S_ISCHR(statbuf.st_mode) && isatty(FD))
    return 0;
  // Return the preferred block size.
  return statbuf.st_blksize;
#else
  return raw_ostream::preferred_buffer_size();
#endif
}